

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O2

void __thiscall
rsg::VariableManager::setValue(VariableManager *this,Variable *variable,ConstValueRangeAccess value)

{
  ValueScope *this_00;
  ValueEntry *pVVar1;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Var2;
  ValueEntry *newEntry;
  ValueEntry *local_38;
  Variable *local_30;
  
  this_00 = (this->m_valueScopeStack).
            super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
  pVVar1 = ValueScope::findEntry(this_00,variable);
  if (pVVar1 == (ValueEntry *)0x0) {
    pVVar1 = ValueScope::allocate(this_00,variable);
    local_38 = pVVar1;
    local_30 = variable;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<rsg::ValueEntry_const**,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::CompareEntryVariable_const>>
                      ((this->m_entryCache).
                       super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->m_entryCache).
                       super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (_Var2._M_current ==
        (this->m_entryCache).
        super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::push_back
                (&this->m_entryCache,&local_38);
    }
    else {
      *_Var2._M_current = pVVar1;
    }
  }
  ValueScope::setValue(this_00,variable,value);
  return;
}

Assistant:

void VariableManager::setValue (const Variable* variable, ConstValueRangeAccess value)
{
	ValueScope& curScope = getCurValueScope();

	if (!curScope.findEntry(variable))
	{
		// New value, allocate and update cache.
		ValueEntry*									newEntry	= curScope.allocate(variable);
		std::vector<const ValueEntry*>::iterator	cachePos	= std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable));

		if (cachePos != m_entryCache.end())
			*cachePos = newEntry;
		else
			m_entryCache.push_back(newEntry);
	}

	curScope.setValue(variable, value);
}